

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# likelihoodfunc.hpp
# Opt level: O2

void __thiscall ftree<double>::addroute(ftree<double> *this,Node *node,uint *edgeid)

{
  map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
  *this_00;
  iterator iVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  initializer_list<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  __l;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_60;
  _Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  local_58;
  _Base_ptr local_40;
  allocator_type local_31;
  
  this_00 = &this->routes;
  iVar1 = std::
          _Rb_tree<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::find(&this_00->_M_t,node);
  local_40 = &(this->routes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (iVar1._M_node == local_40) {
    local_58._M_impl.super__Vector_impl_data._M_start._0_4_ = *edgeid;
    pvVar2 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
             std::
             map<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
             ::operator[](this_00,node);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
              (pvVar2,&local_58,
               (undefined1 *)((long)&local_58._M_impl.super__Vector_impl_data._M_start + 4));
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&iVar1._M_node[1]._M_parent,
               edgeid);
  }
  local_60._M_current = node->_M_current;
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::
  vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::vector((vector<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
            *)&local_58,__l,&local_31);
  addport(this,edgeid,(Nodes *)&local_58);
  std::
  _Vector_base<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>_>
  ::~_Vector_base(&local_58);
  iVar1 = std::
          _Rb_tree<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::_Select1st<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::pair<const___gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
          ::find(&this_00->_M_t,
                 (this->edges).
                 super__Vector_base<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>,_std::allocator<std::array<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>,_2UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[*edgeid]._M_elems);
  if ((iVar1._M_node != local_40) && (iVar1._M_node[1]._M_left != iVar1._M_node[1]._M_parent)) {
    addroute(this,node,&(iVar1._M_node[1]._M_parent)->_M_color);
  }
  return;
}

Assistant:

inline void addroute(const Node& node, const uint& edgeid) {
      auto it = routes.find(node);
      if(it != routes.end()) {
	it->second.push_back(edgeid);
      } else {
        routes[node] = {edgeid};
      }
      addport(edgeid, {node});
      //also update this node's route to former edges
      const auto& edge = edges[edgeid];
      const auto& itfnode = routes.find(edge[0]);
      //if such former edge exist and the joint node is not the headnode
      if(itfnode != routes.end() && itfnode->second.size()) {
	//we assume that in the array of edges each node map to, the smaller
	//the corresponding index is, the closer such edge is to the node
	addroute(node, (itfnode->second)[0]);
      }
    }